

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  result_type_conflict3 *in_RSI;
  param_type *ppVar5;
  ostream *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  poVar4 = std::operator<<(in_RDI,'(');
  _Var3 = Catch::clara::std::setprecision(0x13);
  ppVar5 = (param_type *)(ulong)(uint)_Var3._M_n;
  poVar4 = std::operator<<(poVar4,_Var3);
  gamma_dist<long_double>::param_type::kappa(in_RSI,ppVar5);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ST0);
  ppVar5 = (param_type *)0x20;
  poVar4 = std::operator<<(poVar4,' ');
  gamma_dist<long_double>::param_type::theta(in_RSI,ppVar5);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ST1);
  std::operator<<(poVar4,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<result_type>::digits10 + 1)
            << P.kappa() << ' ' << P.theta() << ')';
        out.flags(flags);
        return out;
      }